

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

void __thiscall csv::CSVReader::CSVReader(CSVReader *this,string_view filename,CSVFormat *format)

{
  IBasicCSVParser *pIVar1;
  ThreadSafeDeque<csv::CSVRow> *this_00;
  CSVGuessResult CVar2;
  MmapParser *this_01;
  CSVFormat *pCVar3;
  string *__return_storage_ptr__;
  string_view filename_00;
  string_view head_00;
  string head;
  
  filename_00._M_len = filename._M_str;
  pCVar3 = format;
  CSVFormat::CSVFormat(&this->_format,format);
  std::make_shared<csv::internals::ColNames>();
  (this->parser)._M_t.
  super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
  .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl =
       (IBasicCSVParser *)0x0;
  this_00 = (ThreadSafeDeque<csv::CSVRow> *)operator_new(0xb8);
  internals::ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(this_00,100);
  (this->records)._M_t.
  super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>._M_head_impl =
       this_00;
  (this->read_csv_worker)._M_id._M_thread = 0;
  this->n_cols = 0;
  this->_n_rows = 0;
  this->header_trimmed = false;
  __return_storage_ptr__ = &head;
  filename_00._M_str = (char *)pCVar3;
  internals::get_csv_head_abi_cxx11_
            (__return_storage_ptr__,(internals *)filename._M_len,filename_00);
  if (1 < (ulong)((long)(format->possible_delimiters).
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(format->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    head_00._M_str = head._M_dataplus._M_p;
    head_00._M_len = (size_t)__return_storage_ptr__;
    CVar2 = internals::_guess_format(head_00,&format->possible_delimiters);
    CSVFormat::delimiter(format,CVar2.delim);
    format->header = CVar2.header_row;
    CSVFormat::operator=(&this->_format,format);
  }
  if ((format->col_names).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (format->col_names).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    set_col_names(this,&format->col_names);
  }
  this_01 = (MmapParser *)operator_new(0x5c0);
  internals::MmapParser::MmapParser(this_01,filename,format,&this->col_names);
  pIVar1 = (this->parser)._M_t.
           super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
           .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl;
  (this->parser)._M_t.
  super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
  .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl =
       (IBasicCSVParser *)this_01;
  if (pIVar1 != (IBasicCSVParser *)0x0) {
    (*pIVar1->_vptr_IBasicCSVParser[1])();
  }
  initial_read(this);
  std::__cxx11::string::~string((string *)&head);
  return;
}

Assistant:

CSV_INLINE CSVReader::CSVReader(csv::string_view filename, CSVFormat format) : _format(format) {
        auto head = internals::get_csv_head(filename);
        using Parser = internals::MmapParser;

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = internals::_guess_format(head, format.possible_delimiters);
            format.delimiter(guess_result.delim);
            format.header = guess_result.header_row;
            this->_format = format;
        }

        if (!format.col_names.empty())
            this->set_col_names(format.col_names);

        this->parser = std::unique_ptr<Parser>(new Parser(filename, format, this->col_names)); // For C++11
        this->initial_read();
    }